

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionStats::SectionStats(SectionStats *this,SectionStats *param_1)

{
  SectionStats *param_1_local;
  SectionStats *this_local;
  
  this->_vptr_SectionStats = (_func_int **)&PTR__SectionStats_0023fd60;
  SectionInfo::SectionInfo(&this->sectionInfo,&param_1->sectionInfo);
  memcpy(&this->assertions,&param_1->assertions,0x21);
  return;
}

Assistant:

SectionStats( SectionStats const& )              = default;